

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spoa_test.cpp
# Opt level: O3

void __thiscall
spoa::test::SpoaTest_SemiGlobalConvexWithQualities_Test::SpoaTest_SemiGlobalConvexWithQualities_Test
          (SpoaTest_SemiGlobalConvexWithQualities_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_SpoaTest).super_Test._vptr_Test = (_func_int **)&PTR__SpoaTest_00164a58;
  (this->super_SpoaTest).s.
  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_SpoaTest).s.
  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_SpoaTest).s.
  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_SpoaTest).ae._M_t.
  super___uniq_ptr_impl<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_>._M_t.
  super__Tuple_impl<0UL,_spoa::AlignmentEngine_*,_std::default_delete<spoa::AlignmentEngine>_>.
  super__Head_base<0UL,_spoa::AlignmentEngine_*,_false>._M_head_impl = (AlignmentEngine *)0x0;
  Graph::Graph(&(this->super_SpoaTest).gr);
  (this->super_SpoaTest).super_Test._vptr_Test = (_func_int **)&PTR__SpoaTest_001648d8;
  return;
}

Assistant:

TEST_F(SpoaTest, SemiGlobalConvexWithQualities) {
  Initialize(AlignmentType::kOV, 5, -4, -8, -6, -10, -2, true);
  Align();

  std::string c =
      "GTATGATGCGCTTTGTTGGCGCGGTGGCTTGATGCAGGGGCTAATCGACCTCTGGCAACCACTTTTCCATGA"
      "CAGGAGTTGAATATGGCATTCAGTAATCCCTTCGATGATCCGCAGGGAGCGTTTTACATATTGCGCAATGCG"
      "CAGGGGCAATTCAGTCTGTGGCCGCAACAATGCGTCTTACCGGCAGGCTGGGACATTGTGTGTCAGCCGCAG"
      "TCACAGGCGTCCTGCCAGCAGTGGCTGGAAGCCCACTGGCGTACTCTGACACCGACGAATTTTACCCAGTTG"
      "CAGGGAGGCACAATGAGCCAGCATTTACCTTTGGTCGCCGCACAGCCCGGCATCTGGATGGCAGAAAAACTG"
      "TCAGAATTACCCTCCGCCTGGAGCGTGGCGCATTACGTTGAGTTAACCGGAGAGGTTGATTCGCCATTACTG"
      "GCCCGCGCGGTGGTTGCCGGACTAGCGCAAAGCAGATACGC";

  Check(c);
}